

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

void tcu::getCubeLinearSamples
               (ConstPixelBufferAccess (*faceAccesses) [6],CubeFace baseFace,float u,float v,
               int depth,Vec4 (*dst) [4])

{
  int size;
  undefined8 uVar1;
  int i_1;
  CubeFace CVar2;
  ulong uVar3;
  undefined8 *puVar4;
  ulong uVar5;
  undefined4 in_register_00000014;
  undefined8 *puVar6;
  int i;
  int iVar7;
  long lVar8;
  long lVar9;
  float fVar10;
  CubeFaceIntCoords CVar11;
  bool hasBothCoordsOutOfBounds [4];
  Vector<float,_4> res;
  IVec2 baseSampleCoords [4];
  Vec4 sampleColors [4];
  char acStack_bc [4];
  ConstPixelBufferAccess local_b8;
  int local_90;
  int local_8c;
  undefined8 *local_80;
  undefined8 local_78 [9];
  
  local_80 = (undefined8 *)CONCAT44(in_register_00000014,depth);
  size = (*faceAccesses)[0].m_size.m_data[0];
  fVar10 = floorf(u + -0.5);
  iVar7 = (int)fVar10;
  fVar10 = floorf(v + -0.5);
  local_b8.m_pitch.m_data[0] = (int)fVar10;
  local_b8.m_size.m_data[2] = iVar7;
  local_b8.m_pitch.m_data[1] = iVar7 + 1;
  local_b8.m_pitch.m_data[2] = local_b8.m_pitch.m_data[0];
  local_b8.m_data._0_4_ = iVar7;
  local_b8.m_data._4_4_ = local_b8.m_pitch.m_data[0] + 1;
  local_90 = iVar7 + 1;
  local_8c = local_b8.m_pitch.m_data[0] + 1;
  puVar6 = local_78;
  local_78[6] = 0;
  local_78[7] = 0;
  local_78[4] = 0;
  local_78[5] = 0;
  local_78[2] = 0;
  local_78[3] = 0;
  local_78[0] = 0;
  local_78[1] = 0;
  lVar8 = 0;
  do {
    uVar1 = *(undefined8 *)(local_b8.m_pitch.m_data + lVar8 * 2 + -1);
    local_b8.m_format.type = (ChannelType)uVar1;
    local_b8.m_size.m_data[0] = (int)((ulong)uVar1 >> 0x20);
    local_b8.m_format.order = baseFace;
    CVar11 = remapCubeEdgeCoords((CubeFaceIntCoords *)&local_b8,size);
    CVar2 = CVar11.face;
    acStack_bc[lVar8] = CVar2 == CUBEFACE_LAST;
    if (CVar2 != CUBEFACE_LAST) {
      lookup(&local_b8,(int)faceAccesses + CVar2 * 0x28,CVar11.s,CVar11.t);
      *puVar6 = CONCAT44(local_b8.m_format.type,local_b8.m_format.order);
      puVar6[1] = CONCAT44(local_b8.m_size.m_data[1],local_b8.m_size.m_data[0]);
    }
    lVar8 = lVar8 + 1;
    puVar6 = puVar6 + 2;
  } while (lVar8 != 4);
  uVar5 = 0xffffffff;
  uVar3 = 0;
  do {
    if (acStack_bc[uVar3] != '\0') {
      uVar5 = uVar3 & 0xffffffff;
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 != 4);
  if ((int)uVar5 != -1) {
    lVar8 = (long)(int)uVar5;
    puVar4 = local_78 + lVar8 * 2;
    *puVar4 = 0;
    local_78[lVar8 * 2 + 1] = 0;
    puVar6 = local_78;
    uVar3 = 0;
    do {
      if (uVar3 != uVar5) {
        lVar9 = 0;
        do {
          *(float *)((long)puVar4 + lVar9 * 4) =
               *(float *)((long)puVar6 + lVar9 * 4) + *(float *)((long)puVar4 + lVar9 * 4);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 4);
      }
      uVar3 = uVar3 + 1;
      puVar6 = puVar6 + 2;
    } while (uVar3 != 4);
    local_b8.m_format.order = R;
    local_b8.m_format.type = SNORM_INT8;
    local_b8.m_size.m_data[0] = 0;
    local_b8.m_size.m_data[1] = 0;
    lVar9 = 0;
    do {
      local_b8.m_size.m_data[lVar9 + -2] = (int)(*(float *)((long)puVar4 + lVar9 * 4) * 0.33333334);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    *puVar4 = CONCAT44(local_b8.m_format.type,local_b8.m_format.order);
    local_78[lVar8 * 2 + 1] = CONCAT44(local_b8.m_size.m_data[1],local_b8.m_size.m_data[0]);
  }
  local_80[6] = local_78[6];
  local_80[7] = local_78[7];
  local_80[4] = local_78[4];
  local_80[5] = local_78[5];
  local_80[2] = local_78[2];
  local_80[3] = local_78[3];
  *local_80 = local_78[0];
  local_80[1] = local_78[1];
  return;
}

Assistant:

static void getCubeLinearSamples (const ConstPixelBufferAccess (&faceAccesses)[CUBEFACE_LAST], CubeFace baseFace, float u, float v, int depth, Vec4 (&dst)[4])
{
	DE_ASSERT(faceAccesses[0].getWidth() == faceAccesses[0].getHeight());
	int		size					= faceAccesses[0].getWidth();
	int		x0						= deFloorFloatToInt32(u-0.5f);
	int		x1						= x0+1;
	int		y0						= deFloorFloatToInt32(v-0.5f);
	int		y1						= y0+1;
	IVec2	baseSampleCoords[4]		=
	{
		IVec2(x0, y0),
		IVec2(x1, y0),
		IVec2(x0, y1),
		IVec2(x1, y1)
	};
	Vec4	sampleColors[4];
	bool	hasBothCoordsOutOfBounds[4]; //!< Whether correctCubeFace() returns CUBEFACE_LAST, i.e. both u and v are out of bounds.

	// Find correct faces and coordinates for out-of-bounds sample coordinates.

	for (int i = 0; i < 4; i++)
	{
		CubeFaceIntCoords coords = remapCubeEdgeCoords(CubeFaceIntCoords(baseFace, baseSampleCoords[i]), size);
		hasBothCoordsOutOfBounds[i] = coords.face == CUBEFACE_LAST;
		if (!hasBothCoordsOutOfBounds[i])
			sampleColors[i] = lookup(faceAccesses[coords.face], coords.s, coords.t, depth);
	}

	// If a sample was out of bounds in both u and v, we get its color from the average of the three other samples.
	// \note This averaging behavior is not required by the GLES3 spec (though it is recommended). GLES3 spec only
	//		 requires that if the three other samples all have the same color, then the doubly-out-of-bounds sample
	//		 must have this color as well.

	{
		int bothOutOfBoundsNdx = -1;
		for (int i = 0; i < 4; i++)
		{
			if (hasBothCoordsOutOfBounds[i])
			{
				DE_ASSERT(bothOutOfBoundsNdx < 0); // Only one sample can be out of bounds in both u and v.
				bothOutOfBoundsNdx = i;
			}
		}
		if (bothOutOfBoundsNdx != -1)
		{
			sampleColors[bothOutOfBoundsNdx] = Vec4(0.0f);
			for (int i = 0; i < 4; i++)
				if (i != bothOutOfBoundsNdx)
					sampleColors[bothOutOfBoundsNdx] += sampleColors[i];

			sampleColors[bothOutOfBoundsNdx] = sampleColors[bothOutOfBoundsNdx] * (1.0f/3.0f);
		}
	}

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(sampleColors); i++)
		dst[i] = sampleColors[i];
}